

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void extend_params(dill_stream_conflict s,int argno)

{
  size_t sVar1;
  dill_reg **ppdVar2;
  arg_info_list paVar3;
  dill_parameter_type **ppdVar4;
  long lVar5;
  private_ctx pdVar6;
  long lVar7;
  long lVar8;
  
  pdVar6 = s->p;
  lVar8 = (long)argno;
  if (pdVar6->c_param_count == 0) {
    sVar1 = lVar8 * 8 + 0x10;
    ppdVar2 = (dill_reg **)dill_malloc(sVar1);
    s->p->c_param_regs = ppdVar2;
    paVar3 = (arg_info_list)dill_malloc((lVar8 + 2) * 0x14);
    s->p->c_param_args = paVar3;
    ppdVar4 = (dill_parameter_type **)dill_malloc(sVar1);
  }
  else {
    if (argno + 1 < pdVar6->c_param_count) goto LAB_00106cb5;
    sVar1 = lVar8 * 8 + 0x10;
    ppdVar2 = (dill_reg **)dill_realloc(pdVar6->c_param_regs,sVar1);
    pdVar6 = s->p;
    pdVar6->c_param_regs = ppdVar2;
    paVar3 = (arg_info_list)dill_realloc(pdVar6->c_param_args,(lVar8 + 2) * 0x14);
    pdVar6 = s->p;
    pdVar6->c_param_args = paVar3;
    ppdVar4 = (dill_parameter_type **)dill_realloc(pdVar6->c_param_structs,sVar1);
  }
  pdVar6 = s->p;
  pdVar6->c_param_structs = ppdVar4;
LAB_00106cb5:
  lVar5 = (long)pdVar6->c_param_count;
  lVar7 = lVar5 * 0x14;
  for (; lVar5 <= lVar8; lVar5 = lVar5 + 1) {
    s->p->c_param_regs[lVar5] = (dill_reg *)0x0;
    pdVar6 = s->p;
    paVar3 = pdVar6->c_param_args;
    *(undefined2 *)(&paVar3->type + lVar7) = 0xb;
    (&paVar3->is_immediate)[lVar7] = '\0';
    *(undefined8 *)((long)&paVar3->in_reg + lVar7) = 0;
    *(undefined4 *)((long)&paVar3->offset + lVar7) = 0;
    pdVar6->c_param_structs[lVar5] = (dill_parameter_type *)0x0;
    lVar7 = lVar7 + 0x14;
  }
  s->p->c_param_count = argno + 1;
  return;
}

Assistant:

static void
extend_params(dill_stream s, int argno)
{
    int i;
    if (s->p->c_param_count == 0) {
        s->p->c_param_regs =
            malloc(sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args =
            malloc(sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            malloc(sizeof(s->p->c_param_structs[0]) * (argno + 2));
    } else if (s->p->c_param_count <= (argno + 1)) {
        s->p->c_param_regs = realloc(
            s->p->c_param_regs, sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args = realloc(
            s->p->c_param_args, sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            realloc(s->p->c_param_structs,
                    sizeof(s->p->c_param_structs[0]) * (argno + 2));
    }
    for (i = s->p->c_param_count; i <= argno; i++) {
        s->p->c_param_regs[i] = NULL;
        s->p->c_param_args[i].type = DILL_V;
        s->p->c_param_args[i].is_register = 0;
        s->p->c_param_args[i].is_immediate = 0;
        s->p->c_param_args[i].in_reg = 0;
        s->p->c_param_args[i].out_reg = 0;
        s->p->c_param_args[i].offset = 0;
        s->p->c_param_structs[i] = NULL;
    }
    s->p->c_param_count = (argno + 1);
}